

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_msg-inl.h
# Opt level: O2

void __thiscall
spdlog::details::log_msg::log_msg
          (log_msg *this,source_loc loc,string_view_t a_logger_name,level_enum lvl,string_view_t msg
          )

{
  rep rVar1;
  size_t sVar2;
  
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->logger_name).data_ = a_logger_name.data_;
  (this->logger_name).size_ = a_logger_name.size_;
  this->level = lvl;
  (this->time).__d.__r = rVar1;
  sVar2 = details::os::thread_id();
  this->thread_id = sVar2;
  this->color_range_start = 0;
  this->color_range_end = 0;
  (this->source).filename = loc.filename;
  (this->source).line = loc.line;
  *(undefined4 *)&(this->source).field_0xc = loc._12_4_;
  (this->source).funcname = loc.funcname;
  (this->payload).data_ = msg.data_;
  (this->payload).size_ = msg.size_;
  return;
}

Assistant:

SPDLOG_INLINE log_msg::log_msg(
    spdlog::source_loc loc, string_view_t a_logger_name, spdlog::level::level_enum lvl, spdlog::string_view_t msg)
    : log_msg(os::now(), loc, a_logger_name, lvl, msg)
{}